

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harvest.cc
# Opt level: O0

void sptk::world::anon_unknown_2::FixStep3
               (double *f0_step2,int f0_length,int number_of_candidates,double **f0_candidates,
               double allowed_range,double **f0_scores,double *f0_step3)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int number_of_boundaries_00;
  ulong uVar4;
  double **multi_channel_f0_00;
  double **multi_channel_f0_01;
  double *pdVar5;
  int in_EDX;
  int in_ESI;
  double *in_RDI;
  int *in_R8;
  double **in_R9;
  int i_2;
  int number_of_channels;
  int i_1;
  double **multi_channel_f0;
  int number_of_boundaries;
  int *boundary_list;
  int i;
  int *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  int iVar6;
  int in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar7;
  
  for (iVar7 = 0; iVar7 < in_ESI; iVar7 = iVar7 + 1) {
    in_R9[iVar7] = (double *)in_RDI[iVar7];
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)in_ESI;
  uVar4 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  multi_channel_f0_00 = (double **)operator_new__(uVar4);
  number_of_boundaries_00 =
       GetBoundaryList((double *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                       in_stack_ffffffffffffff9c,in_stack_ffffffffffffff90);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)(number_of_boundaries_00 / 2);
  uVar4 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  multi_channel_f0_01 = (double **)operator_new__(uVar4);
  for (iVar6 = 0; iVar6 < number_of_boundaries_00 / 2; iVar6 = iVar6 + 1) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (long)in_ESI;
    uVar4 = SUB168(auVar3 * ZEXT816(8),0);
    if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    pdVar5 = (double *)operator_new__(uVar4);
    multi_channel_f0_01[iVar6] = pdVar5;
  }
  GetMultiChannelF0(in_RDI,in_ESI,(int *)multi_channel_f0_00,number_of_boundaries_00,
                    multi_channel_f0_01);
  iVar6 = Extend(multi_channel_f0_00,number_of_boundaries_00,in_stack_ffffffffffffffb8,
                 (int *)multi_channel_f0_01,(double **)CONCAT44(iVar6,in_stack_ffffffffffffffa8),
                 in_stack_ffffffffffffffa4,
                 (double)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),in_R9,in_R8);
  if (iVar6 != 0) {
    MergeF0(in_R9,(int *)CONCAT44(iVar7,in_stack_ffffffffffffffc8),
            (int)((ulong)multi_channel_f0_00 >> 0x20),(int)multi_channel_f0_00,
            (double **)CONCAT44(number_of_boundaries_00,in_stack_ffffffffffffffb8),
            multi_channel_f0_01,in_EDX,in_RDI);
  }
  for (iVar7 = 0; iVar7 < number_of_boundaries_00 / 2; iVar7 = iVar7 + 1) {
    if (multi_channel_f0_01[iVar7] != (double *)0x0) {
      operator_delete__(multi_channel_f0_01[iVar7]);
    }
  }
  if (multi_channel_f0_01 != (double **)0x0) {
    operator_delete__(multi_channel_f0_01);
  }
  if (multi_channel_f0_00 != (double **)0x0) {
    operator_delete__(multi_channel_f0_00);
  }
  return;
}

Assistant:

static void FixStep3(const double *f0_step2, int f0_length,
    int number_of_candidates, const double * const *f0_candidates,
    double allowed_range, const double * const *f0_scores, double *f0_step3) {
  for (int i = 0; i < f0_length; ++i) f0_step3[i] = f0_step2[i];
  int *boundary_list = new int[f0_length];
  int number_of_boundaries =
    GetBoundaryList(f0_step2, f0_length, boundary_list);

  double **multi_channel_f0 = new double *[number_of_boundaries / 2];
  for (int i = 0; i < number_of_boundaries / 2; ++i)
    multi_channel_f0[i] = new double[f0_length];
  GetMultiChannelF0(f0_step2, f0_length, boundary_list, number_of_boundaries,
      multi_channel_f0);

  int number_of_channels =
    Extend(multi_channel_f0, number_of_boundaries / 2, f0_length,
    boundary_list, f0_candidates, number_of_candidates, allowed_range,
    multi_channel_f0, boundary_list);

  if (number_of_channels != 0)
    MergeF0(multi_channel_f0, boundary_list, number_of_channels, f0_length,
        f0_candidates, f0_scores, number_of_candidates, f0_step3);

  for (int i = 0; i < number_of_boundaries / 2; ++i)
    delete[] multi_channel_f0[i];
  delete[] multi_channel_f0;
  delete[] boundary_list;
}